

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.c
# Opt level: O3

void translator_loop_sparc64
               (TranslatorOps *ops,DisasContextBase *db,CPUState *cpu,TranslationBlock *tb,
               int max_insns)

{
  uc_struct_conflict7 *val;
  TCGContext_conflict6 *s;
  target_ulong tVar1;
  void *pvVar2;
  hook *phVar3;
  TranslationBlock *pTVar4;
  bool bVar5;
  _Bool _Var6;
  ushort uVar7;
  int iVar8;
  uintptr_t o_1;
  undefined1 *puVar9;
  list_item *plVar10;
  TCGv_i32 pTVar11;
  TCGv_i64 pTVar12;
  TCGv_i64 pTVar13;
  TCGLabel *pTVar14;
  TCGTemp *pTVar15;
  gpointer pvVar16;
  ulong *puVar17;
  uintptr_t o_2;
  TCGTemp *pTVar18;
  CPUBreakpoint *pCVar19;
  ulong uVar20;
  anon_union_16_2_88bb8dd4_for_ops_free_ops *paVar21;
  uintptr_t o;
  TCGTemp *ts;
  void *local_a8;
  int local_98;
  TCGTemp *local_88;
  TCGTemp *local_80;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TranslatorOps *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  val = cpu->uc;
  s = val->tcg_ctx;
  db->tb = tb;
  tVar1 = tb->pc;
  db->pc_first = tVar1;
  db->pc_next = tVar1;
  db->is_jmp = DISAS_NEXT;
  db->num_insns = 0;
  db->max_insns = max_insns;
  db->singlestep_enabled = cpu->singlestep_enabled != 0;
  (*ops->init_disas_context)(db,cpu);
  local_88 = (TCGTemp *)tb->pc;
  if (val->use_exits == 0) {
    if ((TCGTemp *)val->exits[(long)val->nested_level + -1] == local_88) goto LAB_00a53a3b;
  }
  else {
    puVar9 = (undefined1 *)g_tree_lookup(val->ctl_exits,&local_88);
    if (puVar9 == &DAT_00000001) {
LAB_00a53a3b:
      pTVar14 = gen_new_label_sparc64((TCGContext_conflict8 *)s);
      s->exitreq_label = pTVar14;
      local_98 = 0;
      pTVar15 = tcg_temp_new_internal_sparc64((TCGContext_conflict8 *)s,TCG_TYPE_I32,false);
      tcg_gen_op3_sparc64((TCGContext_conflict8 *)s,INDEX_op_ld_i32,(TCGArg)pTVar15,
                          (long)&s->pool_cur + s->gen_insn_data[0x157][2],0xfffffffffffffff0);
      tcg_gen_brcondi_i32_sparc64
                ((TCGContext_conflict8 *)s,TCG_COND_LT,(TCGv_i32)((long)pTVar15 - (long)s),0,
                 s->exitreq_label);
      tcg_temp_free_internal_sparc64((TCGContext_conflict8 *)s,pTVar15);
      (*ops->tb_start)(db,cpu);
      db->num_insns = db->num_insns + 1;
      (*ops->insn_start)(db,cpu);
      (*ops->translate_insn)(db,cpu);
      local_a8 = (void *)0x0;
      bVar5 = false;
      goto LAB_00a53d4b;
    }
  }
  plVar10 = val->hook[3].head;
  local_98 = 0;
  local_60 = ops;
  if (plVar10 != (list_item *)0x0) {
LAB_00a539d0:
    pvVar2 = plVar10->data;
    if ((*(ulong *)((long)pvVar2 + 0x18) <= *(ulong *)((long)pvVar2 + 0x20) &&
         (*(ulong *)((long)pvVar2 + 0x20) < tb->pc || tb->pc < *(ulong *)((long)pvVar2 + 0x18))) ||
       (*(char *)((long)pvVar2 + 0x14) == '\x01')) goto LAB_00a53a07;
    local_a8 = ((s->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
    tVar1 = db->pc_first;
    pTVar11 = tcg_const_i32_sparc64((TCGContext_conflict8 *)s,-0x7070708);
    pTVar12 = tcg_const_i64_sparc64((TCGContext_conflict8 *)s,(int64_t)val);
    pTVar13 = tcg_const_i64_sparc64((TCGContext_conflict8 *)s,tVar1);
    ts = (TCGTemp *)(pTVar12 + (long)s);
    pTVar15 = (TCGTemp *)(pTVar13 + (long)s);
    pTVar18 = (TCGTemp *)(pTVar11 + (long)s);
    local_40 = (TCGTemp *)0x0;
    local_68 = pTVar18;
    local_58 = ts;
    local_50 = pTVar15;
    local_48 = pTVar18;
    if (val->hooks_count[3] == 1) {
      for (plVar10 = val->hook[3].head; plVar10 != (list_item *)0x0; plVar10 = plVar10->next) {
        phVar3 = (hook *)plVar10->data;
        if (phVar3->to_delete == false) {
          pTVar12 = tcg_const_i64_sparc64((TCGContext_conflict8 *)s,(int64_t)phVar3->user_data);
          local_40 = (TCGTemp *)(pTVar12 + (long)s);
          (*val->add_inline_hook)(val,phVar3,&local_58,4);
          tcg_temp_free_internal_sparc64((TCGContext_conflict8 *)s,(TCGTemp *)(pTVar12 + (long)s));
        }
      }
    }
    else {
      pTVar11 = tcg_const_i32_sparc64((TCGContext_conflict8 *)s,3);
      local_88 = pTVar18;
      local_80 = (TCGTemp *)(pTVar11 + (long)s);
      local_78 = ts;
      local_70 = pTVar15;
      tcg_gen_callN_sparc64
                ((TCGContext_conflict8 *)s,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_88);
      tcg_temp_free_internal_sparc64((TCGContext_conflict8 *)s,(TCGTemp *)(pTVar11 + (long)s));
    }
    tcg_temp_free_internal_sparc64((TCGContext_conflict8 *)s,pTVar15);
    tcg_temp_free_internal_sparc64((TCGContext_conflict8 *)s,ts);
    tcg_temp_free_internal_sparc64((TCGContext_conflict8 *)s,local_68);
    bVar5 = true;
    goto LAB_00a53c4b;
  }
LAB_00a53a0f:
  local_a8 = (void *)0x0;
  bVar5 = false;
LAB_00a53c4b:
  pTVar14 = gen_new_label_sparc64((TCGContext_conflict8 *)s);
  s->exitreq_label = pTVar14;
  pTVar15 = tcg_temp_new_internal_sparc64((TCGContext_conflict8 *)s,TCG_TYPE_I32,false);
  tcg_gen_op3_sparc64((TCGContext_conflict8 *)s,INDEX_op_ld_i32,(TCGArg)pTVar15,
                      (long)&s->pool_cur + s->gen_insn_data[0x157][2],0xfffffffffffffff0);
  tcg_gen_brcondi_i32_sparc64
            ((TCGContext_conflict8 *)s,TCG_COND_LT,(TCGv_i32)((long)pTVar15 - (long)s),0,
             s->exitreq_label);
  tcg_temp_free_internal_sparc64((TCGContext_conflict8 *)s,pTVar15);
  ops = local_60;
  (*local_60->tb_start)(db,cpu);
  iVar8 = db->num_insns;
  do {
    db->num_insns = iVar8 + 1;
    (*ops->insn_start)(db,cpu);
    if ((db->singlestep_enabled == false) &&
       (pCVar19 = (cpu->breakpoints).tqh_first, pCVar19 != (CPUBreakpoint *)0x0)) {
      do {
        if ((pCVar19->pc == db->pc_next) &&
           (_Var6 = (*ops->breakpoint_check)(db,cpu,pCVar19), _Var6)) {
          local_98 = 1;
          break;
        }
        pCVar19 = (pCVar19->entry).tqe_next;
      } while (pCVar19 != (CPUBreakpoint *)0x0);
      if (DISAS_TOO_MANY < db->is_jmp) goto LAB_00a53d4b;
    }
    (*ops->translate_insn)(db,cpu);
    if (db->is_jmp != DISAS_NEXT) goto LAB_00a53d4b;
  } while ((s->nb_ops < 4000) && (iVar8 = db->num_insns, iVar8 < db->max_insns));
  db->is_jmp = DISAS_TOO_MANY;
LAB_00a53d4b:
  (*ops->tb_stop)(db,cpu);
  pTVar4 = db->tb;
  if ((pTVar4->cflags & 0x20000) != 0) {
    *(long *)(s->gen_insn_data[0x156][2] + 0x20) = (long)db->num_insns - (long)local_98;
  }
  pTVar14 = s->exitreq_label;
  *(uint *)pTVar14 = *(uint *)pTVar14 | 1;
  tcg_gen_op1_sparc64((TCGContext_conflict8 *)s,INDEX_op_set_label,(TCGArg)pTVar14);
  tcg_gen_exit_tb_sparc64((TCGContext_conflict8 *)s,pTVar4,3);
  uVar7 = (short)db->pc_next - (short)db->pc_first;
  pTVar4 = db->tb;
  pTVar4->size = uVar7;
  pTVar4->icount = (uint16_t)db->num_insns;
  pTVar15 = (TCGTemp *)pTVar4->pc;
  uVar20 = (ulong)uVar7;
  for (plVar10 = val->hook[2].head; plVar10 != (list_item *)0x0; plVar10 = plVar10->next) {
    pvVar2 = plVar10->data;
    if (((*(TCGTemp **)((long)pvVar2 + 0x20) < *(TCGTemp **)((long)pvVar2 + 0x18) ||
          pTVar15 <= *(TCGTemp **)((long)pvVar2 + 0x20) &&
          *(TCGTemp **)((long)pvVar2 + 0x18) <= pTVar15) && (*(char *)((long)pvVar2 + 0x14) == '\0')
        ) && (local_88 = pTVar15, local_80 = (TCGTemp *)uVar20,
             pvVar16 = g_hash_table_lookup(*(GHashTable **)((long)pvVar2 + 0x38),&local_88),
             pvVar16 == (gpointer)0x0)) {
      puVar17 = (ulong *)malloc(0x10);
      *puVar17 = (ulong)pTVar15;
      puVar17[1] = uVar20;
      g_hash_table_insert(*(GHashTable **)((long)pvVar2 + 0x38),puVar17,&DAT_00000001);
    }
  }
  for (plVar10 = val->hook[3].head; plVar10 != (list_item *)0x0; plVar10 = plVar10->next) {
    pvVar2 = plVar10->data;
    if (((*(TCGTemp **)((long)pvVar2 + 0x20) < *(TCGTemp **)((long)pvVar2 + 0x18) ||
          pTVar15 <= *(TCGTemp **)((long)pvVar2 + 0x20) &&
          *(TCGTemp **)((long)pvVar2 + 0x18) <= pTVar15) && (*(char *)((long)pvVar2 + 0x14) == '\0')
        ) && (local_88 = pTVar15, local_80 = (TCGTemp *)uVar20,
             pvVar16 = g_hash_table_lookup(*(GHashTable **)((long)pvVar2 + 0x38),&local_88),
             pvVar16 == (gpointer)0x0)) {
      puVar17 = (ulong *)malloc(0x10);
      *puVar17 = (ulong)pTVar15;
      puVar17[1] = uVar20;
      g_hash_table_insert(*(GHashTable **)((long)pvVar2 + 0x38),puVar17,&DAT_00000001);
    }
  }
  if (bVar5) {
    paVar21 = &s->ops;
    if (local_a8 != (void *)0x0) {
      paVar21 = (anon_union_16_2_88bb8dd4_for_ops_free_ops *)((long)local_a8 + 8);
    }
    paVar21->tqh_first->args[1] = (ulong)db->tb->size;
  }
  return;
LAB_00a53a07:
  plVar10 = plVar10->next;
  if (plVar10 == (list_item *)0x0) goto LAB_00a53a0f;
  goto LAB_00a539d0;
}

Assistant:

void translator_loop(const TranslatorOps *ops, DisasContextBase *db,
                     CPUState *cpu, TranslationBlock *tb, int max_insns)
{
    int bp_insn = 0;
    struct uc_struct *uc = (struct uc_struct *)cpu->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    TCGOp *prev_op = NULL;
    bool block_hook = false;

    /* Initialize DisasContext */
    db->tb = tb;
    db->pc_first = tb->pc;
    db->pc_next = db->pc_first;
    db->is_jmp = DISAS_NEXT;
    db->num_insns = 0;
    db->max_insns = max_insns;
    db->singlestep_enabled = cpu->singlestep_enabled;

    ops->init_disas_context(db, cpu);
    tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

    /* Reset the temp count so that we can identify leaks */
    tcg_clear_temp_count();

    /* Unicorn: early check to see if the address of this block is
     * the "run until" address. */
    if (uc_addr_is_exit(uc, tb->pc)) {
        // This should catch that instruction is at the end
        // and generate appropriate halting code.
        gen_tb_start(tcg_ctx, db->tb);
        ops->tb_start(db, cpu);
        db->num_insns++;
        ops->insn_start(db, cpu);
        ops->translate_insn(db, cpu);
        goto _end_loop;
    }

    /* Unicorn: trace this block on request
     * Only hook this block if it is not broken from previous translation due to
     * full translation cache
     */
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_BLOCK, tb->pc)) {
        prev_op = tcg_last_op(tcg_ctx);
        block_hook = true;
        gen_uc_tracecode(tcg_ctx, 0xf8f8f8f8, UC_HOOK_BLOCK_IDX, uc, db->pc_first);
    }

    // tcg_dump_ops(tcg_ctx, false, "translator loop");

    /* Start translating.  */
    gen_tb_start(tcg_ctx, db->tb);
    // tcg_dump_ops(tcg_ctx, false, "tb start");

    ops->tb_start(db, cpu);
    // tcg_dump_ops(tcg_ctx, false, "tb start 2");

    tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

    while (true) {
        db->num_insns++;

        ops->insn_start(db, cpu);
        tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

        /* Pass breakpoint hits to target for further processing */
        if (!db->singlestep_enabled
            && unlikely(!QTAILQ_EMPTY(&cpu->breakpoints))) {
            CPUBreakpoint *bp;
            QTAILQ_FOREACH(bp, &cpu->breakpoints, entry) {
                if (bp->pc == db->pc_next) {
                    if (ops->breakpoint_check(db, cpu, bp)) {
                        bp_insn = 1;
                        break;
                    }
                }
            }
            /* The breakpoint_check hook may use DISAS_TOO_MANY to indicate
               that only one more instruction is to be executed.  Otherwise
               it should use DISAS_NORETURN when generating an exception,
               but may use a DISAS_TARGET_* value for Something Else.  */
            if (db->is_jmp > DISAS_TOO_MANY) {
                break;
            }
        }

        /* Disassemble one instruction.  The translate_insn hook should
           update db->pc_next and db->is_jmp to indicate what should be
           done next -- either exiting this loop or locate the start of
           the next instruction.  */
        ops->translate_insn(db, cpu);
        // tcg_dump_ops(tcg_ctx, false, "insn translate");

        /* Stop translation if translate_insn so indicated.  */
        if (db->is_jmp != DISAS_NEXT) {
            break;
        }

        /* Stop translation if the output buffer is full,
           or we have executed all of the allowed instructions.  */
        if (tcg_op_buf_full(tcg_ctx) || db->num_insns >= db->max_insns) {
            db->is_jmp = DISAS_TOO_MANY;
            break;
        }
    }

_end_loop:
    /* Emit code to exit the TB, as indicated by db->is_jmp.  */
    ops->tb_stop(db, cpu);
    gen_tb_end(tcg_ctx, db->tb, db->num_insns - bp_insn);
    // tcg_dump_ops(tcg_ctx, false, "tb end");

    /* The disas_log hook may use these values rather than recompute.  */
    db->tb->size = db->pc_next - db->pc_first;
    db->tb->icount = db->num_insns;

    hooked_regions_check(uc, db->tb->pc, db->tb->size);

    if (block_hook) {
        TCGOp *tcg_op;

        // Unicorn: patch the callback to have the proper block size.
        if (prev_op) {
            // As explained further up in the function where prev_op is
            // assigned, we move forward in the tail queue, so we're modifying the
            // move instruction generated by gen_uc_tracecode() that contains
            // the instruction size to assign the proper size (replacing 0xF1F1F1F1).
            tcg_op = QTAILQ_NEXT(prev_op, link);
        } else {
            // this basic block is the first emulated code ever,
            // so the basic block operand is the first operand
            tcg_op = QTAILQ_FIRST(&tcg_ctx->ops);
        }

        tcg_op->args[1] = db->tb->size;
    }
}